

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O3

int run_test_we_get_signal_one_shot(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  int iVar4;
  timer_ctx tc;
  signal_ctx sc;
  timer_ctx tStack_4f0;
  undefined1 auStack_448 [168];
  undefined1 auStack_3a0 [168];
  undefined1 auStack_2f8 [168];
  signal_ctx sStack_250;
  uv_loop_t *puStack_1a0;
  timer_ctx local_160;
  signal_ctx local_b8;
  
  puVar2 = uv_default_loop();
  start_timer(puVar2,0x11,&local_160);
  start_watcher(puVar2,0x11,&local_b8,1);
  local_b8.stop_or_close = NOOP;
  iVar4 = 0;
  puVar3 = puVar2;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    if (local_160.ncalls != 10) goto LAB_0016910c;
    if (local_b8.ncalls != 1) goto LAB_00169111;
    start_timer(puVar2,0x11,&local_160);
    iVar4 = 0;
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00169116;
    if (local_b8.ncalls != 1) goto LAB_0016911b;
    local_b8.stop_or_close = CLOSE;
    local_b8.ncalls = 0;
    uv_signal_start_oneshot(&local_b8.handle,signal_cb_one_shot,0x11);
    start_timer(puVar2,0x11,&local_160);
    iVar4 = 0;
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00169120;
    if (local_160.ncalls != 10) goto LAB_00169125;
    if (local_b8.ncalls != 1) goto LAB_0016912a;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_0016910c:
    run_test_we_get_signal_one_shot_cold_2();
LAB_00169111:
    run_test_we_get_signal_one_shot_cold_3();
LAB_00169116:
    run_test_we_get_signal_one_shot_cold_4();
LAB_0016911b:
    run_test_we_get_signal_one_shot_cold_5();
LAB_00169120:
    run_test_we_get_signal_one_shot_cold_6();
LAB_00169125:
    run_test_we_get_signal_one_shot_cold_7();
LAB_0016912a:
    run_test_we_get_signal_one_shot_cold_8();
  }
  run_test_we_get_signal_one_shot_cold_9();
  if ((puVar3->wq_mutex).__data.__kind == iVar4) {
    iVar1 = *(int *)&puVar3[-1].field_0x34c;
    *(int *)&puVar3[-1].field_0x34c = iVar1 + 1;
    if (iVar1 == 0) {
      if (puVar3[-1].inotify_fd != 0) {
        return extraout_EAX;
      }
      uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
      return extraout_EAX_00;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_1a0 = puVar2;
  puVar2 = uv_default_loop();
  start_timer(puVar2,0x11,&tStack_4f0);
  start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,1);
  start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,1);
  auStack_448._0_4_ = CLOSE;
  auStack_3a0._0_4_ = CLOSE;
  puVar3 = puVar2;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    if (tStack_4f0.ncalls != 10) goto LAB_00169591;
    if (auStack_448._4_4_ != 1) goto LAB_00169596;
    if (auStack_3a0._4_4_ != 1) goto LAB_0016959b;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,1);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,1);
    auStack_448._0_4_ = CLOSE;
    auStack_3a0._0_4_ = CLOSE;
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,0);
    uv_close((uv_handle_t *)(auStack_2f8 + 8),(uv_close_cb)0x0);
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001695a0;
    if (tStack_4f0.ncalls != 10) goto LAB_001695a5;
    if (auStack_448._4_4_ != 1) goto LAB_001695aa;
    if (auStack_3a0._4_4_ != 1) goto LAB_001695af;
    if (auStack_2f8._4_4_ != 0) goto LAB_001695b4;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,0);
    auStack_448._0_4_ = CLOSE;
    auStack_3a0._0_4_ = CLOSE;
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,1);
    uv_close((uv_handle_t *)(auStack_2f8 + 8),(uv_close_cb)0x0);
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001695b9;
    if (tStack_4f0.ncalls != 10) goto LAB_001695be;
    if (auStack_448._4_4_ != 10) goto LAB_001695c3;
    if (auStack_3a0._4_4_ != 10) goto LAB_001695c8;
    if (auStack_2f8._4_4_ != 0) goto LAB_001695cd;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,1);
    start_watcher(puVar2,0x11,&sStack_250,1);
    auStack_2f8._0_4_ = CLOSE;
    sStack_250.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_448 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_3a0 + 8),(uv_close_cb)0x0);
    puVar3 = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001695d2;
    if (tStack_4f0.ncalls != 10) goto LAB_001695d7;
    if (auStack_448._4_4_ != 0) goto LAB_001695dc;
    if (auStack_3a0._4_4_ != 0) goto LAB_001695e1;
    if (auStack_2f8._4_4_ != 1) goto LAB_001695e6;
    start_timer(puVar2,0x11,&tStack_4f0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_448,0);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_3a0,1);
    start_watcher(puVar2,0x11,(signal_ctx *)auStack_2f8,0);
    start_watcher(puVar2,0x11,&sStack_250,0);
    sStack_250.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_448 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_2f8 + 8),(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001695eb;
    if (tStack_4f0.ncalls != 10) goto LAB_001695f0;
    if (auStack_448._4_4_ != 0) goto LAB_001695f5;
    if (auStack_3a0._4_4_ != 1) goto LAB_001695fa;
    if (auStack_2f8._4_4_ != 0) goto LAB_001695ff;
    if (sStack_250.ncalls == 10) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00169609;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_00169591:
    run_test_we_get_signals_mixed_cold_2();
LAB_00169596:
    run_test_we_get_signals_mixed_cold_3();
LAB_0016959b:
    run_test_we_get_signals_mixed_cold_4();
LAB_001695a0:
    run_test_we_get_signals_mixed_cold_5();
LAB_001695a5:
    run_test_we_get_signals_mixed_cold_6();
LAB_001695aa:
    run_test_we_get_signals_mixed_cold_7();
LAB_001695af:
    run_test_we_get_signals_mixed_cold_8();
LAB_001695b4:
    run_test_we_get_signals_mixed_cold_9();
LAB_001695b9:
    run_test_we_get_signals_mixed_cold_10();
LAB_001695be:
    run_test_we_get_signals_mixed_cold_11();
LAB_001695c3:
    run_test_we_get_signals_mixed_cold_12();
LAB_001695c8:
    run_test_we_get_signals_mixed_cold_13();
LAB_001695cd:
    run_test_we_get_signals_mixed_cold_14();
LAB_001695d2:
    run_test_we_get_signals_mixed_cold_15();
LAB_001695d7:
    run_test_we_get_signals_mixed_cold_16();
LAB_001695dc:
    run_test_we_get_signals_mixed_cold_17();
LAB_001695e1:
    run_test_we_get_signals_mixed_cold_18();
LAB_001695e6:
    puVar2 = puVar3;
    run_test_we_get_signals_mixed_cold_19();
LAB_001695eb:
    run_test_we_get_signals_mixed_cold_20();
LAB_001695f0:
    run_test_we_get_signals_mixed_cold_21();
LAB_001695f5:
    run_test_we_get_signals_mixed_cold_22();
LAB_001695fa:
    run_test_we_get_signals_mixed_cold_23();
LAB_001695ff:
    run_test_we_get_signals_mixed_cold_24();
  }
  run_test_we_get_signals_mixed_cold_25();
LAB_00169609:
  run_test_we_get_signals_mixed_cold_26();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(we_get_signal_one_shot) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 1);
  sc.stop_or_close = NOOP;
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(sc.ncalls == 1);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start_oneshot(&sc.handle, signal_cb_one_shot, SIGCHLD);
  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}